

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iSWAP.cpp
# Opt level: O2

void test_qclab_qgates_iSWAP<std::complex<float>>(void)

{
  complex<float> m32;
  complex<float> m32_00;
  bool bVar1;
  char cVar2;
  long lVar3;
  undefined4 uVar4;
  undefined4 *puVar5;
  stringstream *psVar6;
  char *pcVar7;
  char *pcVar8;
  byte bVar9;
  initializer_list<std::complex<float>_> __l;
  initializer_list<std::complex<float>_> __l_00;
  initializer_list<std::complex<float>_> __l_01;
  initializer_list<std::complex<float>_> __l_02;
  initializer_list<std::complex<float>_> __l_03;
  initializer_list<std::complex<float>_> __l_04;
  initializer_list<std::complex<float>_> __l_05;
  complex<float> in_stack_fffffffffffffa78;
  SquareMatrix<std::complex<float>_> iSWAP_check;
  AssertionResult gtest_ar_5;
  vector<int,_std::allocator<int>_> qubits;
  iSWAP<std::complex<float>_> iswap;
  iSWAP<std::complex<float>_> iswap2;
  int qnew_1 [2];
  AssertionResult gtest_ar__3;
  int qnew [2];
  AssertHelper local_4d0;
  SquareMatrix<std::complex<float>_> I3;
  SquareMatrix<std::complex<float>_> I1;
  stringstream qasm;
  undefined7 uStack_4a7;
  array<int,_2UL> aStack_4a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_498;
  undefined1 *local_488;
  undefined8 uStack_480;
  undefined1 *local_478;
  undefined1 *puStack_470;
  undefined1 local_428 [272];
  V v4;
  V v3;
  SquareMatrix<std::complex<float>_> local_2e8;
  SquareMatrix<std::complex<float>_> local_2d8;
  SquareMatrix<std::complex<float>_> local_2c8;
  SquareMatrix<std::complex<float>_> local_2b8;
  SquareMatrix<std::complex<float>_> local_2a8;
  SquareMatrix<std::complex<float>_> local_298;
  SquareMatrix<std::complex<float>_> local_288;
  SquareMatrix<std::complex<float>_> local_278;
  SquareMatrix<std::complex<float>_> local_268;
  SquareMatrix<std::complex<float>_> local_258;
  SquareMatrix<std::complex<float>_> local_248;
  SquareMatrix<std::complex<float>_> local_238;
  SquareMatrix<std::complex<float>_> local_228;
  SquareMatrix<std::complex<float>_> local_218;
  SquareMatrix<std::complex<float>_> local_208;
  SquareMatrix<std::complex<float>_> local_1f8;
  SquareMatrix<std::complex<float>_> local_1e8;
  SquareMatrix<std::complex<float>_> local_1d8;
  SquareMatrix<std::complex<float>_> local_1c8;
  SquareMatrix<std::complex<float>_> local_1b8;
  SquareMatrix<std::complex<float>_> local_1a8;
  SquareMatrix<std::complex<float>_> local_198;
  SquareMatrix<std::complex<float>_> local_188;
  SquareMatrix<std::complex<float>_> local_178;
  SquareMatrix<std::complex<float>_> local_168;
  SquareMatrix<std::complex<float>_> local_158;
  SquareMatrix<std::complex<float>_> local_148;
  SquareMatrix<std::complex<float>_> local_138;
  SquareMatrix<std::complex<float>_> local_128;
  SquareMatrix<std::complex<float>_> local_118;
  undefined1 *local_108;
  undefined1 *local_100;
  undefined1 *local_f8;
  undefined1 *local_f0;
  undefined1 *local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  undefined1 *local_d0;
  SquareMatrix<std::complex<float>_> local_c8;
  SquareMatrix<std::complex<float>_> local_b8;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 local_70;
  SquareMatrix<std::complex<float>_> I2;
  V v2;
  SquareMatrix<std::complex<float>_> I4;
  
  bVar9 = 0;
  qclab::dense::eye<std::complex<float>>((int64_t)&I1);
  qclab::dense::eye<std::complex<float>>((int64_t)&I2);
  qclab::dense::eye<std::complex<float>>((int64_t)&I3);
  qclab::dense::eye<std::complex<float>>((int64_t)&I4);
  local_498._M_allocated_capacity = 0x40000000;
  local_498._8_8_ = &DAT_40e00000;
  _qasm = &DAT_40400000;
  aStack_4a0._M_elems = (_Type)&DAT_40a00000;
  __l._M_len = 4;
  __l._M_array = (iterator)&qasm;
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::vector
            (&v2,__l,(allocator_type *)&gtest_ar_5);
  local_478 = &DAT_41000000;
  puStack_470 = &DAT_40400000;
  local_488 = &DAT_40800000;
  uStack_480 = 0x3f800000;
  local_498._M_allocated_capacity = 0x40000000;
  local_498._8_8_ = &DAT_40e00000;
  _qasm = &DAT_40400000;
  aStack_4a0._M_elems = (_Type)&DAT_40a00000;
  __l_00._M_len = 8;
  __l_00._M_array = (iterator)&qasm;
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::vector
            (&v3,__l_00,(allocator_type *)&gtest_ar_5);
  puVar5 = &DAT_003f50cc;
  psVar6 = &qasm;
  for (lVar3 = 0x20; lVar3 != 0; lVar3 = lVar3 + -1) {
    *(undefined4 *)psVar6 = *puVar5;
    puVar5 = puVar5 + (ulong)bVar9 * -2 + 1;
    psVar6 = psVar6 + (ulong)bVar9 * -8 + 4;
  }
  __l_01._M_len = 0x10;
  __l_01._M_array = (iterator)&qasm;
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::vector
            (&v4,__l_01,(allocator_type *)&gtest_ar_5);
  iswap.super_QGate2<std::complex<float>_>.super_QObject<std::complex<float>_>._vptr_QObject =
       (QObject<std::complex<float>_>)&PTR_nbQubits_004d0b80;
  iswap.qubits_._M_elems[0] = 0;
  iswap.qubits_._M_elems[1] = 1;
  qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = 2;
  gtest_ar_5._0_4_ = 2;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&qasm,"iswap.nbQubits()","2",(int *)&gtest_ar_5,(int *)&qubits);
  if (qasm == (stringstream)0x0) {
    testing::Message::Message((Message *)&gtest_ar_5);
    if (aStack_4a0._M_elems == (_Type)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = *(char **)aStack_4a0._M_elems;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&qubits,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/iSWAP.cpp"
               ,0x3b,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&qubits,(Message *)&gtest_ar_5);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&qubits);
    if (gtest_ar_5._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_5._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&aStack_4a0);
  qasm = (stringstream)0x1;
  aStack_4a0._M_elems[0] = 0;
  aStack_4a0._M_elems[1] = 0;
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&aStack_4a0);
  qasm = (stringstream)0x1;
  aStack_4a0._M_elems[0] = 0;
  aStack_4a0._M_elems[1] = 0;
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&aStack_4a0);
  gtest_ar_5._0_4_ = iswap.qubits_._M_elems[0];
  qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = 0;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&qasm,"iswap.qubit()","0",(int *)&gtest_ar_5,(int *)&qubits);
  if (qasm == (stringstream)0x0) {
    testing::Message::Message((Message *)&gtest_ar_5);
    if (aStack_4a0._M_elems == (_Type)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = *(char **)aStack_4a0._M_elems;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&qubits,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/iSWAP.cpp"
               ,0x40,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&qubits,(Message *)&gtest_ar_5);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&qubits);
    if (gtest_ar_5._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_5._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&aStack_4a0);
  qclab::qgates::iSWAP<std::complex<float>_>::qubits(&qubits,&iswap);
  gtest_ar_5._0_8_ =
       (long)qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish -
       CONCAT44(qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                ._M_start._4_4_,
                qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                ._M_start._0_4_) >> 2;
  iSWAP_check.size_._0_4_ = 2;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&qasm,"qubits.size()","2",(unsigned_long *)&gtest_ar_5,(int *)&iSWAP_check)
  ;
  if (qasm == (stringstream)0x0) {
    testing::Message::Message((Message *)&gtest_ar_5);
    if (aStack_4a0._M_elems == (_Type)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = *(char **)aStack_4a0._M_elems;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&iSWAP_check,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/iSWAP.cpp"
               ,0x44,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&iSWAP_check,(Message *)&gtest_ar_5);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&iSWAP_check);
    if (gtest_ar_5._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_5._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&aStack_4a0);
  gtest_ar_5._0_8_ = gtest_ar_5._0_8_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&qasm,"qubits[0]","0",
             (int *)CONCAT44(qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start._4_4_,
                             qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start._0_4_),(int *)&gtest_ar_5);
  if (qasm == (stringstream)0x0) {
    testing::Message::Message((Message *)&gtest_ar_5);
    if (aStack_4a0._M_elems == (_Type)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = *(char **)aStack_4a0._M_elems;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&iSWAP_check,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/iSWAP.cpp"
               ,0x45,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&iSWAP_check,(Message *)&gtest_ar_5);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&iSWAP_check);
    if (gtest_ar_5._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_5._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&aStack_4a0);
  gtest_ar_5._0_4_ = 1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&qasm,"qubits[1]","1",
             (int *)(CONCAT44(qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start._4_4_,
                              qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start._0_4_) + 4),(int *)&gtest_ar_5);
  if (qasm == (stringstream)0x0) {
    testing::Message::Message((Message *)&gtest_ar_5);
    if (aStack_4a0._M_elems == (_Type)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = *(char **)aStack_4a0._M_elems;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&iSWAP_check,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/iSWAP.cpp"
               ,0x46,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&iSWAP_check,(Message *)&gtest_ar_5);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&iSWAP_check);
    if (gtest_ar_5._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_5._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&aStack_4a0);
  qnew = (int  [2])&DAT_500000003;
  qclab::qgates::iSWAP<std::complex<float>_>::setQubits(&iswap,qnew);
  qclab::qgates::iSWAP<std::complex<float>_>::qubits
            ((vector<int,_std::allocator<int>_> *)&qasm,&iswap);
  iSWAP_check.size_._0_4_ = 3;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar_5,"iswap.qubits()[0]","3",(int *)_qasm,(int *)&iSWAP_check);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&qasm);
  if (gtest_ar_5.success_ == false) {
    testing::Message::Message((Message *)&qasm);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_5.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = *(char **)gtest_ar_5.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&iSWAP_check,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/iSWAP.cpp"
               ,0x49,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&iSWAP_check,(Message *)&qasm);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&iSWAP_check);
    if ((_func_int **)_qasm != (_func_int **)0x0) {
      (**(code **)(*(_func_int **)_qasm + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_5.message_);
  qclab::qgates::iSWAP<std::complex<float>_>::qubits
            ((vector<int,_std::allocator<int>_> *)&qasm,&iswap);
  iSWAP_check.size_._0_4_ = 5;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar_5,"iswap.qubits()[1]","5",(int *)(_qasm + 4),(int *)&iSWAP_check)
  ;
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&qasm);
  if (gtest_ar_5.success_ == false) {
    testing::Message::Message((Message *)&qasm);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_5.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = *(char **)gtest_ar_5.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&iSWAP_check,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/iSWAP.cpp"
               ,0x4a,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&iSWAP_check,(Message *)&qasm);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&iSWAP_check);
    if ((_func_int **)_qasm != (_func_int **)0x0) {
      (**(code **)(*(_func_int **)_qasm + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_5.message_);
  qnew[0] = 0;
  qnew[1] = 1;
  qclab::qgates::iSWAP<std::complex<float>_>::setQubits(&iswap,qnew);
  local_70 = 0;
  local_80 = 0;
  local_88 = 0;
  local_90 = 0;
  local_98 = 0;
  local_a0 = 0;
  local_78 = 0x3f80000000000000;
  local_a8 = 0x3f800000;
  pcVar8 = (char *)0x0;
  m32._M_value._4_4_ = iSWAP_check.size_._4_4_;
  m32._M_value._0_4_ = (undefined4)iSWAP_check.size_;
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            (&iSWAP_check,(complex<float>)0x0,(complex<float>)0x0,(complex<float>)0x0,
             (complex<float>)0x0,(complex<float>)0x0,(complex<float>)0x0,
             (complex<float>)0x3f80000000000000,(complex<float>)0x0,(complex<float>)0x0,
             (complex<float>)0x0,(complex<float>)0x0,(complex<float>)0x0,(complex<float>)0x3f800000,
             in_stack_fffffffffffffa78,m32,
             (complex<float>)
             iSWAP_check.data_._M_t.
             super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
             .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl);
  qclab::qgates::iSWAP<std::complex<float>_>::matrix((iSWAP<std::complex<float>_> *)&qasm);
  bVar1 = qclab::dense::SquareMatrix<std::complex<float>_>::operator==
                    ((SquareMatrix<std::complex<float>_> *)&qasm,&iSWAP_check);
  gtest_ar_5.success_ = bVar1;
  gtest_ar_5.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::~unique_ptr
            ((unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_> *)
             &aStack_4a0);
  if (gtest_ar_5.success_ == false) {
    testing::Message::Message((Message *)&iswap2);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&qasm,(internal *)&gtest_ar_5,
               (AssertionResult *)"iswap.matrix() == iSWAP_check","false","true",pcVar8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/iSWAP.cpp"
               ,0x55,_qasm);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__3,(Message *)&iswap2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__3);
    std::__cxx11::string::~string((string *)&qasm);
    if ((long *)CONCAT44(iswap2.super_QGate2<std::complex<float>_>.
                         super_QObject<std::complex<float>_>._vptr_QObject._4_4_,
                         (int)iswap2.super_QGate2<std::complex<float>_>.
                              super_QObject<std::complex<float>_>._vptr_QObject) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(iswap2.super_QGate2<std::complex<float>_>.
                                     super_QObject<std::complex<float>_>._vptr_QObject._4_4_,
                                     (int)iswap2.super_QGate2<std::complex<float>_>.
                                          super_QObject<std::complex<float>_>._vptr_QObject) + 8))()
      ;
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_5.message_);
  qclab::qgates::QGate2<std::complex<float>_>::print(&iswap.super_QGate2<std::complex<float>_>);
  std::__cxx11::stringstream::stringstream((stringstream *)&qasm);
  iswap2.super_QGate2<std::complex<float>_>.super_QObject<std::complex<float>_>._vptr_QObject._0_4_
       = qclab::qgates::iSWAP<std::complex<float>_>::toQASM
                   (&iswap,(ostream *)local_498._M_local_buf,0);
  gtest_ar__3._0_8_ = (ulong)(uint)gtest_ar__3._4_4_ << 0x20;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar_5,"iswap.toQASM( qasm )","0",(int *)&iswap2,(int *)&gtest_ar__3);
  if (gtest_ar_5.success_ == false) {
    testing::Message::Message((Message *)&iswap2);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_5.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)gtest_ar_5.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/iSWAP.cpp"
               ,0x5c,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__3,(Message *)&iswap2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__3);
    if ((long *)CONCAT44(iswap2.super_QGate2<std::complex<float>_>.
                         super_QObject<std::complex<float>_>._vptr_QObject._4_4_,
                         (int)iswap2.super_QGate2<std::complex<float>_>.
                              super_QObject<std::complex<float>_>._vptr_QObject) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(iswap2.super_QGate2<std::complex<float>_>.
                                     super_QObject<std::complex<float>_>._vptr_QObject._4_4_,
                                     (int)iswap2.super_QGate2<std::complex<float>_>.
                                          super_QObject<std::complex<float>_>._vptr_QObject) + 8))()
      ;
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_5.message_);
  std::__cxx11::stringbuf::str();
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[19]>
            ((internal *)&iswap2,"qasm.str()","\"iswap q[0], q[1];\\n\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_5,
             (char (*) [19])"iswap q[0], q[1];\n");
  std::__cxx11::string::~string((string *)&gtest_ar_5);
  if ((char)iswap2.super_QGate2<std::complex<float>_>.super_QObject<std::complex<float>_>.
            _vptr_QObject == '\0') {
    testing::Message::Message((Message *)&gtest_ar_5);
    if (iswap2.qubits_._M_elems == (_Type)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)iswap2.qubits_._M_elems;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/iSWAP.cpp"
               ,0x5d,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__3,(Message *)&gtest_ar_5);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__3);
    if (gtest_ar_5._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_5._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&iswap2.qubits_);
  std::__cxx11::stringbuf::str();
  std::operator<<((ostream *)&std::cout,(string *)&gtest_ar_5);
  std::__cxx11::string::~string((string *)&gtest_ar_5);
  uVar4 = 2;
  qclab::qgates::iSWAP<std::complex<float>_>::iSWAP(&iswap2,2,4);
  cVar2 = (**(code **)((long)iswap.super_QGate2<std::complex<float>_>.
                             super_QObject<std::complex<float>_>._vptr_QObject + 0x70))
                    (&iswap,&iswap2);
  gtest_ar__3.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar__3.success_ = (bool)cVar2;
  if (cVar2 == '\0') {
    testing::Message::Message((Message *)qnew_1);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_5,(internal *)&gtest_ar__3,(AssertionResult *)"iswap == iswap2",
               "false","true",pcVar8);
    testing::internal::AssertHelper::AssertHelper
              (&local_4d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/iSWAP.cpp"
               ,0x62,(char *)gtest_ar_5._0_8_);
    testing::internal::AssertHelper::operator=(&local_4d0,(Message *)qnew_1);
    testing::internal::AssertHelper::~AssertHelper(&local_4d0);
    std::__cxx11::string::~string((string *)&gtest_ar_5);
    if (qnew_1 != (int  [2])0x0) {
      (**(code **)(*(long *)qnew_1 + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__3.message_);
  gtest_ar__3.success_ =
       (bool)(**(code **)((long)iswap.super_QGate2<std::complex<float>_>.
                                super_QObject<std::complex<float>_>._vptr_QObject + 0x70))
                       (&iswap,&iswap2);
  gtest_ar__3.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (gtest_ar__3.success_ == false) {
    testing::Message::Message((Message *)qnew_1);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_5,(internal *)&gtest_ar__3,(AssertionResult *)"iswap != iswap2",
               "true","false",pcVar8);
    testing::internal::AssertHelper::AssertHelper
              (&local_4d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/iSWAP.cpp"
               ,99,(char *)gtest_ar_5._0_8_);
    testing::internal::AssertHelper::operator=(&local_4d0,(Message *)qnew_1);
    testing::internal::AssertHelper::~AssertHelper(&local_4d0);
    std::__cxx11::string::~string((string *)&gtest_ar_5);
    if (qnew_1 != (int  [2])0x0) {
      (**(code **)(*(long *)qnew_1 + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__3.message_);
  std::__cxx11::stringstream::~stringstream((stringstream *)&qasm);
  std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::~unique_ptr
            (&iSWAP_check.data_);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&qubits.super__Vector_base<int,_std::allocator<int>_>);
  qclab::qgates::iSWAP<std::complex<float>_>::iSWAP((iSWAP<std::complex<float>_> *)&gtest_ar_5,3,5);
  iswap.super_QGate2<std::complex<float>_>.super_QObject<std::complex<float>_>._vptr_QObject._0_4_ =
       2;
  qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = uVar4;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&qasm,"iswap.nbQubits()","2",(int *)&qubits,(int *)&iswap);
  if (qasm == (stringstream)0x0) {
    testing::Message::Message((Message *)&qubits);
    if (aStack_4a0._M_elems == (_Type)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = *(char **)aStack_4a0._M_elems;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&iswap,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/iSWAP.cpp"
               ,0x69,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&iswap,(Message *)&qubits);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&iswap);
    if ((long *)CONCAT44(qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,
                         qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._4_4_,
                                     qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&aStack_4a0);
  qasm = (stringstream)0x1;
  aStack_4a0._M_elems[0] = 0;
  aStack_4a0._M_elems[1] = 0;
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&aStack_4a0);
  qasm = (stringstream)0x1;
  aStack_4a0._M_elems[0] = 0;
  aStack_4a0._M_elems[1] = 0;
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&aStack_4a0);
  qclab::qgates::iSWAP<std::complex<float>_>::qubits
            ((vector<int,_std::allocator<int>_> *)&qasm,(iSWAP<std::complex<float>_> *)&gtest_ar_5);
  iswap.super_QGate2<std::complex<float>_>.super_QObject<std::complex<float>_>._vptr_QObject._0_4_ =
       3;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&qubits,"iswap.qubits()[0]","3",(int *)_qasm,(int *)&iswap);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&qasm);
  if ((char)qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start == '\0') {
    testing::Message::Message((Message *)&qasm);
    if (qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish == (pointer)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = *(char **)qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&iswap,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/iSWAP.cpp"
               ,0x6c,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&iswap,(Message *)&qasm);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&iswap);
    if ((_func_int **)_qasm != (_func_int **)0x0) {
      (**(code **)(*(_func_int **)_qasm + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish);
  qclab::qgates::iSWAP<std::complex<float>_>::qubits
            ((vector<int,_std::allocator<int>_> *)&qasm,(iSWAP<std::complex<float>_> *)&gtest_ar_5);
  iswap.super_QGate2<std::complex<float>_>.super_QObject<std::complex<float>_>._vptr_QObject._0_4_ =
       5;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&qubits,"iswap.qubits()[1]","5",(int *)(_qasm + 4),(int *)&iswap);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&qasm);
  if ((char)qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start == '\0') {
    testing::Message::Message((Message *)&qasm);
    if (qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish == (pointer)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = *(char **)qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&iswap,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/iSWAP.cpp"
               ,0x6d,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&iswap,(Message *)&qasm);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&iswap);
    if ((_func_int **)_qasm != (_func_int **)0x0) {
      (**(code **)(*(_func_int **)_qasm + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish);
  iswap.super_QGate2<std::complex<float>_>.super_QObject<std::complex<float>_>._vptr_QObject =
       (QObject<std::complex<float>_>)&DAT_500000003;
  qclab::qgates::iSWAP<std::complex<float>_>::iSWAP
            ((iSWAP<std::complex<float>_> *)&gtest_ar_5,(int *)&iswap);
  iSWAP_check.size_._0_4_ = uVar4;
  qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = uVar4;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&qasm,"iswap.nbQubits()","2",(int *)&qubits,(int *)&iSWAP_check);
  if (qasm == (stringstream)0x0) {
    testing::Message::Message((Message *)&qubits);
    if (aStack_4a0._M_elems == (_Type)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = *(char **)aStack_4a0._M_elems;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&iSWAP_check,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/iSWAP.cpp"
               ,0x74,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&iSWAP_check,(Message *)&qubits);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&iSWAP_check);
    if ((long *)CONCAT44(qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,
                         qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._4_4_,
                                     qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&aStack_4a0);
  qasm = (stringstream)0x1;
  aStack_4a0._M_elems[0] = 0;
  aStack_4a0._M_elems[1] = 0;
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&aStack_4a0);
  qasm = (stringstream)0x1;
  aStack_4a0._M_elems[0] = 0;
  aStack_4a0._M_elems[1] = 0;
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&aStack_4a0);
  qclab::qgates::iSWAP<std::complex<float>_>::qubits
            ((vector<int,_std::allocator<int>_> *)&qasm,(iSWAP<std::complex<float>_> *)&gtest_ar_5);
  iSWAP_check.size_._0_4_ = 3;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&qubits,"iswap.qubits()[0]","3",(int *)_qasm,(int *)&iSWAP_check);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&qasm);
  if ((char)qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start == '\0') {
    testing::Message::Message((Message *)&qasm);
    if (qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish == (pointer)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = *(char **)qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&iSWAP_check,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/iSWAP.cpp"
               ,0x77,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&iSWAP_check,(Message *)&qasm);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&iSWAP_check);
    if ((_func_int **)_qasm != (_func_int **)0x0) {
      (**(code **)(*(_func_int **)_qasm + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish);
  qclab::qgates::iSWAP<std::complex<float>_>::qubits
            ((vector<int,_std::allocator<int>_> *)&qasm,(iSWAP<std::complex<float>_> *)&gtest_ar_5);
  iSWAP_check.size_._0_4_ = 5;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&qubits,"iswap.qubits()[1]","5",(int *)(_qasm + 4),(int *)&iSWAP_check);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&qasm);
  if ((char)qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start == '\0') {
    testing::Message::Message((Message *)&qasm);
    if (qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish == (pointer)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = *(char **)qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&iSWAP_check,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/iSWAP.cpp"
               ,0x78,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&iSWAP_check,(Message *)&qasm);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&iSWAP_check);
    if ((_func_int **)_qasm != (_func_int **)0x0) {
      (**(code **)(*(_func_int **)_qasm + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish);
  qclab::qgates::iSWAP<std::complex<float>_>::iSWAP((iSWAP<std::complex<float>_> *)qnew,0,1);
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::vector
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)&gtest_ar_5,&v2);
  qclab::qgates::iSWAP<std::complex<float>_>::apply
            ((iSWAP<std::complex<float>_> *)qnew,NoTrans,2,
             (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)&gtest_ar_5,0);
  local_498._M_allocated_capacity = 0x40a0000000000000;
  local_498._8_8_ = &DAT_40e00000;
  _qasm = &DAT_40400000;
  aStack_4a0._M_elems[0] = 0;
  aStack_4a0._M_elems[1] = 0x40000000;
  __l_02._M_len = 4;
  __l_02._M_array = (iterator)&qasm;
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::vector
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)&qubits,__l_02,
             (allocator_type *)&iswap);
  test_qclab_qgates_iSWAP_check<std::complex<float>>
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)&gtest_ar_5,
             (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)&qubits);
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::operator=
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)&gtest_ar_5,&v2);
  qclab::qgates::iSWAP<std::complex<float>_>::apply
            ((iSWAP<std::complex<float>_> *)qnew,ConjTrans,2,
             (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)&gtest_ar_5,0);
  local_498._M_allocated_capacity = 0xc0a0000000000000;
  local_498._8_8_ = &DAT_40e00000;
  _qasm = &DAT_40400000;
  aStack_4a0._M_elems[0] = 0;
  aStack_4a0._M_elems[1] = -0x40000000;
  std::vector<std::complex<float>,std::allocator<std::complex<float>>>::
  _M_assign_aux<std::complex<float>const*>
            ((vector<std::complex<float>,std::allocator<std::complex<float>>> *)&qubits,&qasm);
  test_qclab_qgates_iSWAP_check<std::complex<float>>
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)&gtest_ar_5,
             (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)&qubits);
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::vector
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)&iswap,&v3);
  qclab::qgates::iSWAP<std::complex<float>_>::apply
            ((iSWAP<std::complex<float>_> *)qnew,NoTrans,3,
             (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)&iswap,0);
  local_478 = &DAT_41000000;
  puStack_470 = &DAT_40400000;
  local_488 = (undefined1 *)0x4000000000000000;
  uStack_480 = 0x40e0000000000000;
  local_498._M_allocated_capacity = 0x4080000000000000;
  local_498._8_8_ = 0x3f80000000000000;
  _qasm = &DAT_40400000;
  aStack_4a0._M_elems = (_Type)&DAT_40a00000;
  __l_03._M_len = 8;
  __l_03._M_array = (iterator)&qasm;
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::vector
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)&iSWAP_check,
             __l_03,(allocator_type *)&iswap2);
  test_qclab_qgates_iSWAP_check<std::complex<float>>
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)&iswap,
             (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)&iSWAP_check);
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::operator=
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)&iswap,&v3);
  qclab::qgates::iSWAP<std::complex<float>_>::apply
            ((iSWAP<std::complex<float>_> *)qnew,ConjTrans,3,
             (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)&iswap,0);
  local_478 = &DAT_41000000;
  puStack_470 = &DAT_40400000;
  local_488 = (undefined1 *)0xc000000000000000;
  uStack_480 = 0xc0e0000000000000;
  local_498._M_allocated_capacity = 0xc080000000000000;
  local_498._8_8_ = 0xbf80000000000000;
  _qasm = &DAT_40400000;
  aStack_4a0._M_elems = (_Type)&DAT_40a00000;
  std::vector<std::complex<float>,std::allocator<std::complex<float>>>::
  _M_assign_aux<std::complex<float>const*>
            ((vector<std::complex<float>,std::allocator<std::complex<float>>> *)&iSWAP_check,&qasm);
  test_qclab_qgates_iSWAP_check<std::complex<float>>
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)&iswap,
             (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)&iSWAP_check);
  qnew_1[0] = 1;
  qnew_1[1] = 2;
  qclab::qgates::iSWAP<std::complex<float>_>::setQubits((iSWAP<std::complex<float>_> *)qnew,qnew_1);
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::operator=
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)&iswap,&v3);
  qclab::qgates::iSWAP<std::complex<float>_>::apply
            ((iSWAP<std::complex<float>_> *)qnew,NoTrans,3,
             (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)&iswap,0);
  local_478 = (undefined1 *)0x3f80000000000000;
  puStack_470 = &DAT_40400000;
  local_488 = &DAT_40800000;
  uStack_480 = 0x4100000000000000;
  local_498._M_allocated_capacity = 0x40a0000000000000;
  local_498._8_8_ = &DAT_40e00000;
  _qasm = &DAT_40400000;
  aStack_4a0._M_elems[0] = 0;
  aStack_4a0._M_elems[1] = 0x40000000;
  std::vector<std::complex<float>,std::allocator<std::complex<float>>>::
  _M_assign_aux<std::complex<float>const*>
            ((vector<std::complex<float>,std::allocator<std::complex<float>>> *)&iSWAP_check,&qasm);
  test_qclab_qgates_iSWAP_check<std::complex<float>>
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)&iswap,
             (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)&iSWAP_check);
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::operator=
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)&iswap,&v3);
  qclab::qgates::iSWAP<std::complex<float>_>::apply
            ((iSWAP<std::complex<float>_> *)qnew,ConjTrans,3,
             (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)&iswap,0);
  local_478 = (undefined1 *)0xbf80000000000000;
  puStack_470 = &DAT_40400000;
  local_488 = &DAT_40800000;
  uStack_480 = 0xc100000000000000;
  local_498._M_allocated_capacity = 0xc0a0000000000000;
  local_498._8_8_ = &DAT_40e00000;
  _qasm = &DAT_40400000;
  aStack_4a0._M_elems[0] = 0;
  aStack_4a0._M_elems[1] = -0x40000000;
  std::vector<std::complex<float>,std::allocator<std::complex<float>>>::
  _M_assign_aux<std::complex<float>const*>
            ((vector<std::complex<float>,std::allocator<std::complex<float>>> *)&iSWAP_check,&qasm);
  test_qclab_qgates_iSWAP_check<std::complex<float>>
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)&iswap,
             (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)&iSWAP_check);
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::vector
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)&iswap2,&v4);
  qclab::qgates::iSWAP<std::complex<float>_>::apply
            ((iSWAP<std::complex<float>_> *)qnew,NoTrans,4,
             (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)&iswap2,0);
  puVar5 = &DAT_003f524c;
  psVar6 = &qasm;
  for (lVar3 = 0x20; lVar3 != 0; lVar3 = lVar3 + -1) {
    *(undefined4 *)psVar6 = *puVar5;
    puVar5 = puVar5 + (ulong)bVar9 * -2 + 1;
    psVar6 = psVar6 + (ulong)bVar9 * -8 + 4;
  }
  __l_04._M_len = 0x10;
  __l_04._M_array = (iterator)&qasm;
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::vector
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)&gtest_ar__3,
             __l_04,(allocator_type *)&local_4d0);
  test_qclab_qgates_iSWAP_check<std::complex<float>>
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)&iswap2,
             (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)&gtest_ar__3);
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::operator=
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)&iswap2,&v4);
  qclab::qgates::iSWAP<std::complex<float>_>::apply
            ((iSWAP<std::complex<float>_> *)qnew,ConjTrans,4,
             (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)&iswap2,0);
  puVar5 = &DAT_003f52cc;
  psVar6 = &qasm;
  for (lVar3 = 0x20; lVar3 != 0; lVar3 = lVar3 + -1) {
    *(undefined4 *)psVar6 = *puVar5;
    puVar5 = puVar5 + (ulong)bVar9 * -2 + 1;
    psVar6 = psVar6 + (ulong)bVar9 * -8 + 4;
  }
  std::vector<std::complex<float>,std::allocator<std::complex<float>>>::
  _M_assign_aux<std::complex<float>const*>
            ((vector<std::complex<float>,std::allocator<std::complex<float>>> *)&gtest_ar__3,&qasm,
             local_428);
  test_qclab_qgates_iSWAP_check<std::complex<float>>
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)&iswap2,
             (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)&gtest_ar__3);
  qnew_1[0] = 0;
  qnew_1[1] = 1;
  qclab::qgates::iSWAP<std::complex<float>_>::setQubits((iSWAP<std::complex<float>_> *)qnew,qnew_1);
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::operator=
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)&iswap2,&v4);
  qclab::qgates::iSWAP<std::complex<float>_>::apply
            ((iSWAP<std::complex<float>_> *)qnew,NoTrans,4,
             (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)&iswap2,0);
  puVar5 = &DAT_003f534c;
  psVar6 = &qasm;
  for (lVar3 = 0x20; lVar3 != 0; lVar3 = lVar3 + -1) {
    *(undefined4 *)psVar6 = *puVar5;
    puVar5 = puVar5 + (ulong)bVar9 * -2 + 1;
    psVar6 = psVar6 + (ulong)bVar9 * -8 + 4;
  }
  std::vector<std::complex<float>,std::allocator<std::complex<float>>>::
  _M_assign_aux<std::complex<float>const*>
            ((vector<std::complex<float>,std::allocator<std::complex<float>>> *)&gtest_ar__3,&qasm,
             local_428);
  test_qclab_qgates_iSWAP_check<std::complex<float>>
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)&iswap2,
             (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)&gtest_ar__3);
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::operator=
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)&iswap2,&v4);
  qclab::qgates::iSWAP<std::complex<float>_>::apply
            ((iSWAP<std::complex<float>_> *)qnew,ConjTrans,4,
             (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)&iswap2,0);
  puVar5 = &DAT_003f53cc;
  psVar6 = &qasm;
  for (lVar3 = 0x20; lVar3 != 0; lVar3 = lVar3 + -1) {
    *(undefined4 *)psVar6 = *puVar5;
    puVar5 = puVar5 + (ulong)bVar9 * -2 + 1;
    psVar6 = psVar6 + (ulong)bVar9 * -8 + 4;
  }
  std::vector<std::complex<float>,std::allocator<std::complex<float>>>::
  _M_assign_aux<std::complex<float>const*>
            ((vector<std::complex<float>,std::allocator<std::complex<float>>> *)&gtest_ar__3,&qasm,
             local_428);
  test_qclab_qgates_iSWAP_check<std::complex<float>>
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)&iswap2,
             (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)&gtest_ar__3);
  qnew_1[0] = 2;
  qnew_1[1] = 3;
  qclab::qgates::iSWAP<std::complex<float>_>::setQubits((iSWAP<std::complex<float>_> *)qnew,qnew_1);
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::operator=
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)&iswap2,&v4);
  qclab::qgates::iSWAP<std::complex<float>_>::apply
            ((iSWAP<std::complex<float>_> *)qnew,NoTrans,4,
             (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)&iswap2,0);
  puVar5 = &DAT_003f544c;
  psVar6 = &qasm;
  for (lVar3 = 0x20; lVar3 != 0; lVar3 = lVar3 + -1) {
    *(undefined4 *)psVar6 = *puVar5;
    puVar5 = puVar5 + (ulong)bVar9 * -2 + 1;
    psVar6 = psVar6 + (ulong)bVar9 * -8 + 4;
  }
  std::vector<std::complex<float>,std::allocator<std::complex<float>>>::
  _M_assign_aux<std::complex<float>const*>
            ((vector<std::complex<float>,std::allocator<std::complex<float>>> *)&gtest_ar__3,&qasm,
             local_428);
  test_qclab_qgates_iSWAP_check<std::complex<float>>
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)&iswap2,
             (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)&gtest_ar__3);
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::operator=
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)&iswap2,&v4);
  qclab::qgates::iSWAP<std::complex<float>_>::apply
            ((iSWAP<std::complex<float>_> *)qnew,ConjTrans,4,
             (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)&iswap2,0);
  puVar5 = &DAT_003f54cc;
  psVar6 = &qasm;
  for (lVar3 = 0x20; lVar3 != 0; lVar3 = lVar3 + -1) {
    *(undefined4 *)psVar6 = *puVar5;
    puVar5 = puVar5 + (ulong)bVar9 * -2 + 1;
    psVar6 = psVar6 + (ulong)bVar9 * -8 + 4;
  }
  std::vector<std::complex<float>,std::allocator<std::complex<float>>>::
  _M_assign_aux<std::complex<float>const*>
            ((vector<std::complex<float>,std::allocator<std::complex<float>>> *)&gtest_ar__3,&qasm,
             local_428);
  test_qclab_qgates_iSWAP_check<std::complex<float>>
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)&iswap2,
             (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)&gtest_ar__3);
  std::_Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>::~_Vector_base
            ((_Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
             &gtest_ar__3);
  std::_Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>::~_Vector_base
            ((_Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_> *)&iswap2);
  std::_Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>::~_Vector_base
            ((_Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
             &iSWAP_check);
  std::_Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>::~_Vector_base
            ((_Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_> *)&iswap);
  std::_Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>::~_Vector_base
            ((_Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_> *)&qubits);
  std::_Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>::~_Vector_base
            ((_Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_> *)&gtest_ar_5
            );
  qclab::qgates::iSWAP<std::complex<float>_>::iSWAP(&iswap,0,2);
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::vector
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)&gtest_ar_5,&v3);
  qclab::qgates::iSWAP<std::complex<float>_>::apply
            (&iswap,NoTrans,3,
             (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)&gtest_ar_5,0);
  local_478 = (undefined1 *)0x40e0000000000000;
  puStack_470 = &DAT_40400000;
  local_488 = (undefined1 *)0x40a0000000000000;
  uStack_480 = 0x3f800000;
  local_498._M_allocated_capacity = 0x40000000;
  local_498._8_8_ = 0x4100000000000000;
  _qasm = &DAT_40400000;
  aStack_4a0._M_elems[0] = 0;
  aStack_4a0._M_elems[1] = 0x40800000;
  __l_05._M_len = 8;
  __l_05._M_array = (iterator)&qasm;
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::vector
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)&qubits,__l_05,
             (allocator_type *)&iSWAP_check);
  test_qclab_qgates_iSWAP_check<std::complex<float>>
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)&gtest_ar_5,
             (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)&qubits);
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::operator=
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)&gtest_ar_5,&v3);
  qclab::qgates::iSWAP<std::complex<float>_>::apply
            (&iswap,ConjTrans,3,
             (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)&gtest_ar_5,0);
  local_478 = (undefined1 *)0xc0e0000000000000;
  puStack_470 = &DAT_40400000;
  local_488 = (undefined1 *)0xc0a0000000000000;
  uStack_480 = 0x3f800000;
  local_498._M_allocated_capacity = 0x40000000;
  local_498._8_8_ = 0xc100000000000000;
  _qasm = &DAT_40400000;
  aStack_4a0._M_elems[0] = 0;
  aStack_4a0._M_elems[1] = -0x3f800000;
  std::vector<std::complex<float>,std::allocator<std::complex<float>>>::
  _M_assign_aux<std::complex<float>const*>
            ((vector<std::complex<float>,std::allocator<std::complex<float>>> *)&qubits,&qasm);
  test_qclab_qgates_iSWAP_check<std::complex<float>>
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)&gtest_ar_5,
             (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)&qubits);
  std::_Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>::~_Vector_base
            ((_Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_> *)&qubits);
  std::_Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>::~_Vector_base
            ((_Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_> *)&gtest_ar_5
            );
  qclab::qgates::iSWAP<std::complex<float>_>::iSWAP((iSWAP<std::complex<float>_> *)&qasm,0,1);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar_5,&I2);
  qclab::qgates::iSWAP<std::complex<float>_>::apply
            ((iSWAP<std::complex<float>_> *)&qasm,Left,NoTrans,2,
             (SquareMatrix<std::complex<float>_> *)&gtest_ar_5,0);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            (&local_b8,(SquareMatrix<std::complex<float>_> *)&gtest_ar_5);
  qclab::qgates::iSWAP<std::complex<float>_>::matrix((iSWAP<std::complex<float>_> *)&local_c8);
  test_qclab_qgates_iSWAP_check<qclab::dense::SquareMatrix<std::complex<float>>>
            (&local_b8,&local_c8);
  std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::~unique_ptr
            (&local_c8.data_);
  std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::~unique_ptr
            (&local_b8.data_);
  local_d0 = &DAT_41100000;
  local_d8 = &DAT_41200000;
  local_e0 = &DAT_41300000;
  local_e8 = &DAT_41400000;
  local_f0 = &DAT_41500000;
  local_f8 = &DAT_41600000;
  local_100 = &DAT_41700000;
  local_108 = &DAT_41800000;
  m32_00._M_value._4_4_ = iSWAP_check.size_._4_4_;
  m32_00._M_value._0_4_ = (undefined4)iSWAP_check.size_;
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&qubits,(complex<float>)0x41800000,
             (complex<float>)0x41300000,(complex<float>)0x41200000,(complex<float>)0x41700000,
             (complex<float>)0x41600000,(complex<float>)0x41100000,(complex<float>)0x41200000,
             (complex<float>)0x41300000,(complex<float>)0x41400000,(complex<float>)0x41500000,
             (complex<float>)0x41600000,(complex<float>)0x41700000,(complex<float>)0x41800000,
             in_stack_fffffffffffffa78,m32_00,
             (complex<float>)
             iSWAP_check.data_._M_t.
             super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
             .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl);
  qclab::dense::SquareMatrix<std::complex<float>_>::operator=
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar_5,
             (SquareMatrix<std::complex<float>_> *)&qubits);
  qclab::qgates::iSWAP<std::complex<float>_>::apply
            ((iSWAP<std::complex<float>_> *)&qasm,Left,NoTrans,2,
             (SquareMatrix<std::complex<float>_> *)&gtest_ar_5,0);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            (&local_118,(SquareMatrix<std::complex<float>_> *)&gtest_ar_5);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            (&local_138,(SquareMatrix<std::complex<float>_> *)&qubits);
  qclab::qgates::iSWAP<std::complex<float>_>::matrix(&iswap);
  qclab::dense::operator*
            ((dense *)&local_128,&local_138,(SquareMatrix<std::complex<float>_> *)&iswap);
  test_qclab_qgates_iSWAP_check<qclab::dense::SquareMatrix<std::complex<float>>>
            (&local_118,&local_128);
  std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::~unique_ptr
            (&local_128.data_);
  std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::~unique_ptr
            ((unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_> *)
             &iswap.qubits_);
  std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::~unique_ptr
            (&local_138.data_);
  std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::~unique_ptr
            (&local_118.data_);
  qclab::dense::SquareMatrix<std::complex<float>_>::operator=
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar_5,
             (SquareMatrix<std::complex<float>_> *)&qubits);
  qclab::qgates::iSWAP<std::complex<float>_>::apply
            ((iSWAP<std::complex<float>_> *)&qasm,Right,NoTrans,2,
             (SquareMatrix<std::complex<float>_> *)&gtest_ar_5,0);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            (&local_148,(SquareMatrix<std::complex<float>_> *)&gtest_ar_5);
  qclab::qgates::iSWAP<std::complex<float>_>::matrix((iSWAP<std::complex<float>_> *)&local_168);
  qclab::dense::operator*
            ((dense *)&local_158,&local_168,(SquareMatrix<std::complex<float>_> *)&qubits);
  test_qclab_qgates_iSWAP_check<qclab::dense::SquareMatrix<std::complex<float>>>
            (&local_148,&local_158);
  std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::~unique_ptr
            (&local_158.data_);
  std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::~unique_ptr
            (&local_168.data_);
  std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::~unique_ptr
            (&local_148.data_);
  qclab::qgates::iSWAP<std::complex<float>_>::matrix((iSWAP<std::complex<float>_> *)&iSWAP_check);
  qclab::dense::conjTrans<qclab::dense::SquareMatrix<std::complex<float>>>
            ((dense *)&iswap,&iSWAP_check);
  std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::~unique_ptr
            (&iSWAP_check.data_);
  qclab::dense::SquareMatrix<std::complex<float>_>::operator=
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar_5,
             (SquareMatrix<std::complex<float>_> *)&qubits);
  qclab::qgates::iSWAP<std::complex<float>_>::apply
            ((iSWAP<std::complex<float>_> *)&qasm,Left,ConjTrans,2,
             (SquareMatrix<std::complex<float>_> *)&gtest_ar_5,0);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            (&local_178,(SquareMatrix<std::complex<float>_> *)&gtest_ar_5);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            (&local_198,(SquareMatrix<std::complex<float>_> *)&qubits);
  qclab::dense::operator*
            ((dense *)&local_188,&local_198,(SquareMatrix<std::complex<float>_> *)&iswap);
  test_qclab_qgates_iSWAP_check<qclab::dense::SquareMatrix<std::complex<float>>>
            (&local_178,&local_188);
  std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::~unique_ptr
            (&local_188.data_);
  std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::~unique_ptr
            (&local_198.data_);
  std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::~unique_ptr
            (&local_178.data_);
  qclab::dense::SquareMatrix<std::complex<float>_>::operator=
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar_5,
             (SquareMatrix<std::complex<float>_> *)&qubits);
  qclab::qgates::iSWAP<std::complex<float>_>::apply
            ((iSWAP<std::complex<float>_> *)&qasm,Right,ConjTrans,2,
             (SquareMatrix<std::complex<float>_> *)&gtest_ar_5,0);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            (&local_1a8,(SquareMatrix<std::complex<float>_> *)&gtest_ar_5);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            (&local_1c8,(SquareMatrix<std::complex<float>_> *)&iswap);
  qclab::dense::operator*
            ((dense *)&local_1b8,&local_1c8,(SquareMatrix<std::complex<float>_> *)&qubits);
  test_qclab_qgates_iSWAP_check<qclab::dense::SquareMatrix<std::complex<float>>>
            (&local_1a8,&local_1b8);
  std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::~unique_ptr
            (&local_1b8.data_);
  std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::~unique_ptr
            (&local_1c8.data_);
  std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::~unique_ptr
            (&local_1a8.data_);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix(&iSWAP_check,&I3);
  qclab::qgates::iSWAP<std::complex<float>_>::apply
            ((iSWAP<std::complex<float>_> *)&qasm,Left,NoTrans,3,&iSWAP_check,0);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix(&local_1d8,&iSWAP_check);
  qclab::qgates::iSWAP<std::complex<float>_>::matrix(&iswap2);
  qclab::dense::kron<std::complex<float>>
            ((dense *)&local_1e8,(SquareMatrix<std::complex<float>_> *)&iswap2,&I1);
  test_qclab_qgates_iSWAP_check<qclab::dense::SquareMatrix<std::complex<float>>>
            (&local_1d8,&local_1e8);
  std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::~unique_ptr
            (&local_1e8.data_);
  std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::~unique_ptr
            ((unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_> *)
             &iswap2.qubits_);
  std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::~unique_ptr
            (&local_1d8.data_);
  qclab::dense::SquareMatrix<std::complex<float>_>::operator=(&iSWAP_check,&I3);
  qclab::qgates::iSWAP<std::complex<float>_>::apply
            ((iSWAP<std::complex<float>_> *)&qasm,Right,NoTrans,3,&iSWAP_check,0);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix(&local_1f8,&iSWAP_check);
  qclab::qgates::iSWAP<std::complex<float>_>::matrix(&iswap2);
  qclab::dense::kron<std::complex<float>>
            ((dense *)&local_208,(SquareMatrix<std::complex<float>_> *)&iswap2,&I1);
  test_qclab_qgates_iSWAP_check<qclab::dense::SquareMatrix<std::complex<float>>>
            (&local_1f8,&local_208);
  std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::~unique_ptr
            (&local_208.data_);
  std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::~unique_ptr
            ((unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_> *)
             &iswap2.qubits_);
  std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::~unique_ptr
            (&local_1f8.data_);
  qclab::dense::SquareMatrix<std::complex<float>_>::operator=(&iSWAP_check,&I3);
  qclab::qgates::iSWAP<std::complex<float>_>::apply
            ((iSWAP<std::complex<float>_> *)&qasm,Left,ConjTrans,3,&iSWAP_check,0);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix(&local_218,&iSWAP_check);
  qclab::dense::kron<std::complex<float>>
            ((dense *)&local_228,(SquareMatrix<std::complex<float>_> *)&iswap,&I1);
  test_qclab_qgates_iSWAP_check<qclab::dense::SquareMatrix<std::complex<float>>>
            (&local_218,&local_228);
  std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::~unique_ptr
            (&local_228.data_);
  std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::~unique_ptr
            (&local_218.data_);
  qclab::dense::SquareMatrix<std::complex<float>_>::operator=(&iSWAP_check,&I3);
  qclab::qgates::iSWAP<std::complex<float>_>::apply
            ((iSWAP<std::complex<float>_> *)&qasm,Right,ConjTrans,3,&iSWAP_check,0);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix(&local_238,&iSWAP_check);
  qclab::dense::kron<std::complex<float>>
            ((dense *)&local_248,(SquareMatrix<std::complex<float>_> *)&iswap,&I1);
  test_qclab_qgates_iSWAP_check<qclab::dense::SquareMatrix<std::complex<float>>>
            (&local_238,&local_248);
  std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::~unique_ptr
            (&local_248.data_);
  std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::~unique_ptr
            (&local_238.data_);
  gtest_ar__3.success_ = true;
  gtest_ar__3._1_7_ = 0x2000000;
  qclab::qgates::iSWAP<std::complex<float>_>::setQubits
            ((iSWAP<std::complex<float>_> *)&qasm,(int *)&gtest_ar__3);
  qclab::dense::SquareMatrix<std::complex<float>_>::operator=(&iSWAP_check,&I3);
  qclab::qgates::iSWAP<std::complex<float>_>::apply
            ((iSWAP<std::complex<float>_> *)&qasm,Left,NoTrans,3,&iSWAP_check,0);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix(&local_258,&iSWAP_check);
  qclab::qgates::iSWAP<std::complex<float>_>::matrix(&iswap2);
  qclab::dense::kron<std::complex<float>>
            ((dense *)&local_268,&I1,(SquareMatrix<std::complex<float>_> *)&iswap2);
  test_qclab_qgates_iSWAP_check<qclab::dense::SquareMatrix<std::complex<float>>>
            (&local_258,&local_268);
  std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::~unique_ptr
            (&local_268.data_);
  std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::~unique_ptr
            ((unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_> *)
             &iswap2.qubits_);
  std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::~unique_ptr
            (&local_258.data_);
  qclab::dense::SquareMatrix<std::complex<float>_>::operator=(&iSWAP_check,&I3);
  qclab::qgates::iSWAP<std::complex<float>_>::apply
            ((iSWAP<std::complex<float>_> *)&qasm,Right,NoTrans,3,&iSWAP_check,0);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix(&local_278,&iSWAP_check);
  qclab::qgates::iSWAP<std::complex<float>_>::matrix(&iswap2);
  qclab::dense::kron<std::complex<float>>
            ((dense *)&local_288,&I1,(SquareMatrix<std::complex<float>_> *)&iswap2);
  test_qclab_qgates_iSWAP_check<qclab::dense::SquareMatrix<std::complex<float>>>
            (&local_278,&local_288);
  std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::~unique_ptr
            (&local_288.data_);
  std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::~unique_ptr
            ((unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_> *)
             &iswap2.qubits_);
  std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::~unique_ptr
            (&local_278.data_);
  qclab::dense::SquareMatrix<std::complex<float>_>::operator=(&iSWAP_check,&I3);
  qclab::qgates::iSWAP<std::complex<float>_>::apply
            ((iSWAP<std::complex<float>_> *)&qasm,Left,ConjTrans,3,&iSWAP_check,0);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix(&local_298,&iSWAP_check);
  qclab::dense::kron<std::complex<float>>
            ((dense *)&local_2a8,&I1,(SquareMatrix<std::complex<float>_> *)&iswap);
  test_qclab_qgates_iSWAP_check<qclab::dense::SquareMatrix<std::complex<float>>>
            (&local_298,&local_2a8);
  std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::~unique_ptr
            (&local_2a8.data_);
  std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::~unique_ptr
            (&local_298.data_);
  qclab::dense::SquareMatrix<std::complex<float>_>::operator=(&iSWAP_check,&I3);
  qclab::qgates::iSWAP<std::complex<float>_>::apply
            ((iSWAP<std::complex<float>_> *)&qasm,Right,ConjTrans,3,&iSWAP_check,0);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix(&local_2b8,&iSWAP_check);
  qclab::dense::kron<std::complex<float>>
            ((dense *)&local_2c8,&I1,(SquareMatrix<std::complex<float>_> *)&iswap);
  test_qclab_qgates_iSWAP_check<qclab::dense::SquareMatrix<std::complex<float>>>
            (&local_2b8,&local_2c8);
  std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::~unique_ptr
            (&local_2c8.data_);
  std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::~unique_ptr
            (&local_2b8.data_);
  std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::~unique_ptr
            (&iSWAP_check.data_);
  std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::~unique_ptr
            ((unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_> *)
             &iswap.qubits_);
  std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::~unique_ptr
            ((unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_> *)
             &qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_finish);
  std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::~unique_ptr
            ((unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_> *)
             &gtest_ar_5.message_);
  qclab::qgates::iSWAP<std::complex<float>_>::iSWAP((iSWAP<std::complex<float>_> *)&qasm,0,2);
  qclab::dense::zeros<std::complex<float>>((int64_t)&gtest_ar_5);
  *(undefined8 *)
   gtest_ar_5.message_._M_t.
   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
   ._M_t.
   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
   .
   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
   ._M_head_impl = 0x3f800000;
  *(undefined8 *)
   ((long)gtest_ar_5.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl + 0x20 + gtest_ar_5._0_8_ * 8) = 0x3f80000000000000;
  *(undefined8 *)
   ((long)gtest_ar_5.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl + 0x10 + gtest_ar_5._0_8_ * 0x10) = 0x3f800000;
  *(undefined8 *)
   ((long)gtest_ar_5.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl + 0x30 + gtest_ar_5._0_8_ * 0x18) = 0x3f80000000000000;
  *(undefined8 *)
   ((long)gtest_ar_5.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl + 8 + gtest_ar_5._0_8_ * 0x20) = 0x3f80000000000000;
  *(undefined8 *)
   ((long)gtest_ar_5.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl + 0x28 + gtest_ar_5._0_8_ * 0x28) = 0x3f800000;
  *(undefined8 *)
   ((long)gtest_ar_5.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl + 0x18 + gtest_ar_5._0_8_ * 0x30) = 0x3f80000000000000;
  *(undefined8 *)
   ((long)gtest_ar_5.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl + 0x38 + gtest_ar_5._0_8_ * 0x38) = 0x3f800000;
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&qubits,&I3);
  qclab::qgates::iSWAP<std::complex<float>_>::apply
            ((iSWAP<std::complex<float>_> *)&qasm,Left,NoTrans,3,
             (SquareMatrix<std::complex<float>_> *)&qubits,0);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            (&local_2d8,(SquareMatrix<std::complex<float>_> *)&qubits);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            (&local_2e8,(SquareMatrix<std::complex<float>_> *)&gtest_ar_5);
  test_qclab_qgates_iSWAP_check<qclab::dense::SquareMatrix<std::complex<float>>>
            (&local_2d8,&local_2e8);
  std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::~unique_ptr
            (&local_2e8.data_);
  std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::~unique_ptr
            (&local_2d8.data_);
  std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::~unique_ptr
            ((unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_> *)
             &qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_finish);
  std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::~unique_ptr
            ((unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_> *)
             &gtest_ar_5.message_);
  std::_Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>::~_Vector_base
            (&v4.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>);
  std::_Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>::~_Vector_base
            (&v3.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>);
  std::_Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>::~_Vector_base
            (&v2.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>);
  std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::~unique_ptr
            (&I4.data_);
  std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::~unique_ptr
            (&I3.data_);
  std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::~unique_ptr
            (&I2.data_);
  std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::~unique_ptr
            (&I1.data_);
  return;
}

Assistant:

void test_qclab_qgates_iSWAP() {

  const auto I1 = qclab::dense::eye< T >(  2 ) ;
  const auto I2 = qclab::dense::eye< T >(  4 ) ;
  const auto I3 = qclab::dense::eye< T >(  8 ) ;
  const auto I4 = qclab::dense::eye< T >( 16 ) ;

  using V = std::vector< T > ;
  const V v2 = { 3 , 5 , 2 , 7 } ;
  const V v3 = { 3 , 5 , 2 , 7 , 4 , 1 , 8 , 3 } ;
  const V v4 = { 3 , 5 , 2 , 7 , 4 , 1 , 8 , 3 , 7 , 2 , 5 , 6 , 8 , 9 , 5 , 1};

  {
    qclab::qgates::iSWAP< T >  iswap ;

    EXPECT_EQ( iswap.nbQubits() , 2 ) ;   // nbQubits
    EXPECT_TRUE( iswap.fixed() ) ;        // fixed
    EXPECT_FALSE( iswap.controlled() ) ;  // controlled

    // qubit
    EXPECT_EQ( iswap.qubit() , 0 ) ;

    // qubits
    auto qubits = iswap.qubits() ;
    EXPECT_EQ( qubits.size() , 2 ) ;
    EXPECT_EQ( qubits[0] , 0 ) ;
    EXPECT_EQ( qubits[1] , 1 ) ;
    int qnew[] = { 3 , 5 } ;
    iswap.setQubits( &qnew[0] ) ;
    EXPECT_EQ( iswap.qubits()[0] , 3 ) ;
    EXPECT_EQ( iswap.qubits()[1] , 5 ) ;
    qnew[0] = 0 ;
    qnew[1] = 1 ;
    iswap.setQubits( &qnew[0] ) ;

    // matrix
    const T i(0,1) ;
    qclab::dense::SquareMatrix< T >  iSWAP_check( 1 , 0 , 0 , 0 ,
                                                  0 , 0 , i , 0 ,
                                                  0 , i , 0 , 0 ,
                                                  0 , 0 , 0 , 1 ) ;
    EXPECT_TRUE( iswap.matrix() == iSWAP_check ) ;

    // print
    iswap.print() ;

    // toQASM
    std::stringstream qasm ;
    EXPECT_EQ( iswap.toQASM( qasm ) , 0 ) ;
    EXPECT_EQ( qasm.str() , "iswap q[0], q[1];\n" ) ;
    std::cout << qasm.str() ;

    // operators == and !=
    qclab::qgates::iSWAP< T >  iswap2( 2 , 4 ) ;
    EXPECT_TRUE(  iswap == iswap2 ) ;
    EXPECT_FALSE( iswap != iswap2 ) ;
  }

  {
    qclab::qgates::iSWAP< T >  iswap( 3 , 5 ) ;

    EXPECT_EQ( iswap.nbQubits() , 2 ) ;   // nbQubits
    EXPECT_TRUE( iswap.fixed() ) ;        // fixed
    EXPECT_FALSE( iswap.controlled() ) ;  // controlled
    EXPECT_EQ( iswap.qubits()[0] , 3 ) ;  // qubit0
    EXPECT_EQ( iswap.qubits()[1] , 5 ) ;  // qubit1
  }

  {
    int qubits[] = { 3 , 5 } ;
    qclab::qgates::iSWAP< T >  iswap( &qubits[0] ) ;

    EXPECT_EQ( iswap.nbQubits() , 2 ) ;   // nbQubits
    EXPECT_TRUE( iswap.fixed() ) ;        // fixed
    EXPECT_FALSE( iswap.controlled() ) ;  // controlled
    EXPECT_EQ( iswap.qubits()[0] , 3 ) ;  // qubit0
    EXPECT_EQ( iswap.qubits()[1] , 5 ) ;  // qubit1
  }

  {
    qclab::qgates::iSWAP< T >  iswap( 0 , 1 ) ;

    // apply (2 qubits)
    auto vec2 = v2 ;
    iswap.apply( qclab::Op::NoTrans , 2 , vec2 ) ;
    V check2 = { 3 , T(0,2) , T(0,5) , 7 } ;
    test_qclab_qgates_iSWAP_check( vec2 , check2 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec2 = v2 ; T* vec2_ = vec2.data() ;
    #pragma omp target data map(tofrom:vec2_[0:4])
    { iswap.apply_device( qclab::Op::NoTrans , 2 , vec2_ ) ; }
    test_qclab_qgates_iSWAP_check( vec2 , check2 ) ;
  #endif
    vec2 = v2 ;
    iswap.apply( qclab::Op::ConjTrans , 2 , vec2 ) ;
    check2 = { 3 , T(0,-2) , T(0,-5) , 7 } ;
    test_qclab_qgates_iSWAP_check( vec2 , check2 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec2 = v2 ;
    #pragma omp target data map(tofrom:vec2_[0:4])
    { iswap.apply_device( qclab::Op::ConjTrans , 2 , vec2_ ) ; }
    test_qclab_qgates_iSWAP_check( vec2 , check2 ) ;
  #endif

    // apply (3 qubits)
    auto vec3 = v3 ;
    iswap.apply( qclab::Op::NoTrans , 3 , vec3 ) ;
    V check3 = { 3 , 5 , T(0,4) , T(0,1) , T(0,2) , T(0,7) , 8 , 3 } ;
    test_qclab_qgates_iSWAP_check( vec3 , check3 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec3 = v3 ; T* vec3_ = vec3.data() ;
    #pragma omp target data map(tofrom:vec3_[0:8])
    { iswap.apply_device( qclab::Op::NoTrans , 3 , vec3_ ) ; }
    test_qclab_qgates_iSWAP_check( vec3 , check3 ) ;
  #endif
    vec3 = v3 ;
    iswap.apply( qclab::Op::ConjTrans , 3 , vec3 ) ;
    check3 = { 3 , 5 , T(0,-4) , T(0,-1) , T(0,-2) , T(0,-7) , 8 , 3 } ;
    test_qclab_qgates_iSWAP_check( vec3 , check3 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec3 = v3 ;
    #pragma omp target data map(tofrom:vec3_[0:8])
    { iswap.apply_device( qclab::Op::ConjTrans , 3 , vec3_ ) ; }
    test_qclab_qgates_iSWAP_check( vec3 , check3 ) ;
  #endif

    int qnew[] = { 1 , 2 } ;
    iswap.setQubits( &qnew[0] ) ;
    vec3 = v3 ;
    iswap.apply( qclab::Op::NoTrans , 3 , vec3 ) ;
    check3 = { 3 , T(0,2) , T(0,5) , 7 , 4 , T(0,8) , T(0,1) , 3 } ;
    test_qclab_qgates_iSWAP_check( vec3 , check3 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec3 = v3 ;
    #pragma omp target data map(tofrom:vec3_[0:8])
    { iswap.apply_device( qclab::Op::NoTrans , 3 , vec3_ ) ; }
    test_qclab_qgates_iSWAP_check( vec3 , check3 ) ;
  #endif
    vec3 = v3 ;
    iswap.apply( qclab::Op::ConjTrans , 3 , vec3 ) ;
    check3 = { 3 , T(0,-2) , T(0,-5) , 7 , 4 , T(0,-8) , T(0,-1) , 3 } ;
    test_qclab_qgates_iSWAP_check( vec3 , check3 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec3 = v3 ;
    #pragma omp target data map(tofrom:vec3_[0:8])
    { iswap.apply_device( qclab::Op::ConjTrans , 3 , vec3_ ) ; }
    test_qclab_qgates_iSWAP_check( vec3 , check3 ) ;
  #endif

    // apply (4 qubits)
    auto vec4 = v4 ;
    iswap.apply( qclab::Op::NoTrans , 4 , vec4 ) ;
    V check4 = { 3 , 5 , T(0,4) , T(0,1) , T(0,2) , T(0,7) , 8 , 3 ,
                 7 , 2 , T(0,8) , T(0,9) , T(0,5) , T(0,6) , 5 , 1 } ;
    test_qclab_qgates_iSWAP_check( vec4 , check4 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec4 = v4 ; T* vec4_ = vec4.data() ;
    #pragma omp target data map(tofrom:vec4_[0:16])
    { iswap.apply_device( qclab::Op::NoTrans , 4 , vec4_ ) ; }
    test_qclab_qgates_iSWAP_check( vec4 , check4 ) ;
  #endif
    vec4 = v4 ;
    iswap.apply( qclab::Op::ConjTrans , 4 , vec4 ) ;
    check4 = { 3 , 5 , T(0,-4) , T(0,-1) , T(0,-2) , T(0,-7) , 8 , 3 ,
               7 , 2 , T(0,-8) , T(0,-9) , T(0,-5) , T(0,-6) , 5 , 1 } ;
    test_qclab_qgates_iSWAP_check( vec4 , check4 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec4 = v4 ;
    #pragma omp target data map(tofrom:vec4_[0:16])
    { iswap.apply_device( qclab::Op::ConjTrans , 4 , vec4_ ) ; }
    test_qclab_qgates_iSWAP_check( vec4 , check4 ) ;
  #endif

    qnew[0] = 0 ;
    qnew[1] = 1 ;
    iswap.setQubits( &qnew[0] ) ;
    vec4 = v4 ;
    iswap.apply( qclab::Op::NoTrans , 4 , vec4 ) ;
    check4 = { 3 , 5 , 2 , 7 , T(0,7) , T(0,2) , T(0,5) , T(0,6) ,
               T(0,4) , T(0,1) , T(0,8) , T(0,3) , 8 , 9 , 5 , 1 } ;
    test_qclab_qgates_iSWAP_check( vec4 , check4 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec4 = v4 ;
    #pragma omp target data map(tofrom:vec4_[0:16])
    { iswap.apply_device( qclab::Op::NoTrans , 4 , vec4_ ) ; }
    test_qclab_qgates_iSWAP_check( vec4 , check4 ) ;
  #endif
    vec4 = v4 ;
    iswap.apply( qclab::Op::ConjTrans , 4 , vec4 ) ;
    check4 = { 3 , 5 , 2 , 7 , T(0,-7) , T(0,-2) , T(0,-5) , T(0,-6) ,
               T(0,-4) , T(0,-1) , T(0,-8) , T(0,-3) , 8 , 9 , 5 , 1 } ;
    test_qclab_qgates_iSWAP_check( vec4 , check4 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec4 = v4 ;
    #pragma omp target data map(tofrom:vec4_[0:16])
    { iswap.apply_device( qclab::Op::ConjTrans , 4 , vec4_ ) ; }
    test_qclab_qgates_iSWAP_check( vec4 , check4 ) ;
  #endif

    qnew[0] = 2 ;
    qnew[1] = 3 ;
    iswap.setQubits( &qnew[0] ) ;
    vec4 = v4 ;
    iswap.apply( qclab::Op::NoTrans , 4 , vec4 ) ;
    check4 = { 3 , T(0,2) , T(0,5) , 7 , 4 , T(0,8) , T(0,1) , 3 ,
               7 , T(0,5) , T(0,2) , 6 , 8 , T(0,5) , T(0,9) , 1 } ;
    test_qclab_qgates_iSWAP_check( vec4 , check4 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec4 = v4 ;
    #pragma omp target data map(tofrom:vec4_[0:16])
    { iswap.apply_device( qclab::Op::NoTrans , 4 , vec4_ ) ; }
    test_qclab_qgates_iSWAP_check( vec4 , check4 ) ;
  #endif
    vec4 = v4 ;
    iswap.apply( qclab::Op::ConjTrans , 4 , vec4 ) ;
    check4 = { 3 , T(0,-2) , T(0,-5) , 7 , 4 , T(0,-8) , T(0,-1) , 3 ,
               7 , T(0,-5) , T(0,-2) , 6 , 8 , T(0,-5) , T(0,-9) , 1 } ;
    test_qclab_qgates_iSWAP_check( vec4 , check4 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec4 = v4 ;
    #pragma omp target data map(tofrom:vec4_[0:16])
    { iswap.apply_device( qclab::Op::ConjTrans , 4 , vec4_ ) ; }
    test_qclab_qgates_iSWAP_check( vec4 , check4 ) ;
  #endif
  }

  {
    qclab::qgates::iSWAP< T >  iswap( 0 , 2 ) ;

    // apply (3 qubits)
    auto vec3 = v3 ;
    iswap.apply( qclab::Op::NoTrans , 3 , vec3 ) ;
    V check3 = { 3 , T(0,4) , 2 , T(0,8) , T(0,5) , 1 , T(0,7) , 3 } ;
    test_qclab_qgates_iSWAP_check( vec3 , check3 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec3 = v3 ; T* vec3_ = vec3.data() ;
    #pragma omp target data map(tofrom:vec3_[0:8])
    { iswap.apply_device( qclab::Op::NoTrans , 3 , vec3_ ) ; }
    test_qclab_qgates_iSWAP_check( vec3 , check3 ) ;
  #endif
    vec3 = v3 ;
    iswap.apply( qclab::Op::ConjTrans , 3 , vec3 ) ;
    check3 = { 3 , T(0,-4) , 2 , T(0,-8) , T(0,-5) , 1 , T(0,-7) , 3 } ;
    test_qclab_qgates_iSWAP_check( vec3 , check3 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec3 = v3 ;
    #pragma omp target data map(tofrom:vec3_[0:8])
    { iswap.apply_device( qclab::Op::ConjTrans , 3 , vec3_ ) ; }
    test_qclab_qgates_iSWAP_check( vec3 , check3 ) ;
  #endif
  }

  {
    qclab::qgates::iSWAP< T >  iswap( 0 , 1 ) ;

    // apply (2 qubits)
    auto mat2 = I2 ;
    iswap.apply( qclab::Side::Left , qclab::Op::NoTrans , 2 , mat2 ) ;
    test_qclab_qgates_iSWAP_check( mat2 , iswap.matrix() ) ;

    qclab::dense::SquareMatrix< T >  mat(  1 ,  2 ,  3 ,  4 ,
                                           5 ,  6 ,  7 ,  8 ,
                                           9 , 10 , 11 , 12 ,
                                          13 , 14 , 15 , 16 ) ;

    mat2 = mat ;
    iswap.apply( qclab::Side::Left , qclab::Op::NoTrans , 2 , mat2 ) ;
    test_qclab_qgates_iSWAP_check( mat2 , mat * iswap.matrix() ) ;

    mat2 = mat ;
    iswap.apply( qclab::Side::Right , qclab::Op::NoTrans , 2 , mat2 ) ;
    test_qclab_qgates_iSWAP_check( mat2 , iswap.matrix() * mat ) ;

    auto iswapH = qclab::dense::conjTrans( iswap.matrix() ) ;

    mat2 = mat ;
    iswap.apply( qclab::Side::Left , qclab::Op::ConjTrans , 2 , mat2 ) ;
    test_qclab_qgates_iSWAP_check( mat2 , mat * iswapH ) ;

    mat2 = mat ;
    iswap.apply( qclab::Side::Right , qclab::Op::ConjTrans , 2 , mat2 ) ;
    test_qclab_qgates_iSWAP_check( mat2 , iswapH * mat ) ;

    // apply (3 qubits)
    auto mat3 = I3 ;
    iswap.apply( qclab::Side::Left , qclab::Op::NoTrans , 3 , mat3 ) ;
    test_qclab_qgates_iSWAP_check( mat3 ,
                                   qclab::dense::kron( iswap.matrix() , I1 ) ) ;

    mat3 = I3 ;
    iswap.apply( qclab::Side::Right , qclab::Op::NoTrans , 3 , mat3 ) ;
    test_qclab_qgates_iSWAP_check( mat3 ,
                                   qclab::dense::kron( iswap.matrix() , I1 ) ) ;

    mat3 = I3 ;
    iswap.apply( qclab::Side::Left , qclab::Op::ConjTrans , 3 , mat3 ) ;
    test_qclab_qgates_iSWAP_check( mat3 , qclab::dense::kron( iswapH , I1 ) ) ;

    mat3 = I3 ;
    iswap.apply( qclab::Side::Right , qclab::Op::ConjTrans , 3 , mat3 ) ;
    test_qclab_qgates_iSWAP_check( mat3 , qclab::dense::kron( iswapH , I1 ) ) ;

    int qnew[] = { 1 , 2 } ;
    iswap.setQubits( &qnew[0] ) ;
    mat3 = I3 ;
    iswap.apply( qclab::Side::Left , qclab::Op::NoTrans , 3 , mat3 ) ;
    test_qclab_qgates_iSWAP_check( mat3 ,
                                   qclab::dense::kron( I1 , iswap.matrix() ) ) ;

    mat3 = I3 ;
    iswap.apply( qclab::Side::Right , qclab::Op::NoTrans , 3 , mat3 ) ;
    test_qclab_qgates_iSWAP_check( mat3 ,
                                   qclab::dense::kron( I1 , iswap.matrix() ) ) ;

    mat3 = I3 ;
    iswap.apply( qclab::Side::Left , qclab::Op::ConjTrans , 3 , mat3 ) ;
    test_qclab_qgates_iSWAP_check( mat3 , qclab::dense::kron( I1 , iswapH ) ) ;

    mat3 = I3 ;
    iswap.apply( qclab::Side::Right , qclab::Op::ConjTrans , 3 , mat3 ) ;
    test_qclab_qgates_iSWAP_check( mat3 , qclab::dense::kron( I1 , iswapH ) ) ;
  }

  {
    qclab::qgates::iSWAP< T >  iswap( 0 , 2 ) ;

    const T i(0,1) ;
    auto check = qclab::dense::zeros< T >( 8 ) ;
    check(0,0) = 1 ;
    check(4,1) = i ;
    check(2,2) = 1 ;
    check(6,3) = i ;
    check(1,4) = i ;
    check(5,5) = 1 ;
    check(3,6) = i ;
    check(7,7) = 1 ;

    // apply (3 qubits)
    auto mat3 = I3 ;
    iswap.apply( qclab::Side::Left , qclab::Op::NoTrans , 3 , mat3 ) ;
    test_qclab_qgates_iSWAP_check( mat3 , check ) ;
  }

}